

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = X->n;
  if (sVar7 == 0) {
    return 0;
  }
  lVar1 = sVar7 * 0x40 + 0x40;
  do {
    sVar7 = sVar7 - 1;
    if (sVar7 == 0) {
      uVar2 = *X->p;
      lVar1 = 0x40;
      break;
    }
    uVar2 = X->p[sVar7];
    lVar1 = lVar1 + -0x40;
  } while (uVar2 == 0);
  if ((long)uVar2 < 0) {
    lVar5 = 0;
  }
  else {
    uVar6 = 0x8000000000000000;
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 1;
      if (0x3e < uVar3) break;
      uVar6 = uVar6 >> 1;
      uVar3 = uVar4;
    } while ((uVar6 & uVar2) == 0);
    lVar5 = -uVar4;
  }
  return lVar1 + lVar5;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    j = biL - mbedtls_clz( X->p[i] );

    return( ( i * biL ) + j );
}